

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

Type __thiscall
Fixpp::FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_>::get
          (FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_> *this)

{
  int64_t iVar1;
  
  iVar1 = details::LexicalCast<Fixpp::Type::Int>::cast((this->m_view).first,(this->m_view).second);
  return iVar1;
}

Assistant:

Type get() const
        {
            return details::LexicalCast<typename TagT::Type>::cast(m_view.first, m_view.second);
        }